

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256_32.c
# Opt level: O2

_Bool Hacl_Bignum256_32_mod_exp_consttime
                (uint32_t *n,uint32_t *a,uint32_t bBits,uint32_t *b,uint32_t *res)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t *b_00;
  uint32_t r2 [8];
  uint32_t local_58 [10];
  
  b_00 = a;
  uVar1 = exp_check(n,a,bBits,b);
  uVar2 = Hacl_Bignum_Lib_bn_get_top_index_u32((uint32_t)n,b_00);
  if (uVar1 == 0xffffffff) {
    local_58[4] = 0;
    local_58[5] = 0;
    local_58[6] = 0;
    local_58[7] = 0;
    local_58[0] = 0;
    local_58[1] = 0;
    local_58[2] = 0;
    local_58[3] = 0;
    precompr2(uVar2 << 5,n,local_58);
    uVar2 = Hacl_Bignum_ModInvLimb_mod_inv_uint32(*n);
    exp_consttime_precomp(n,uVar2,local_58,a,bBits,b,res);
  }
  else {
    res[4] = 0;
    res[5] = 0;
    res[6] = 0;
    res[7] = 0;
    res[0] = 0;
    res[1] = 0;
    res[2] = 0;
    res[3] = 0;
  }
  return uVar1 == 0xffffffff;
}

Assistant:

bool
Hacl_Bignum256_32_mod_exp_consttime(
  uint32_t *n,
  uint32_t *a,
  uint32_t bBits,
  uint32_t *b,
  uint32_t *res
)
{
  uint32_t is_valid_m = exp_check(n, a, bBits, b);
  uint32_t nBits = 32U * Hacl_Bignum_Lib_bn_get_top_index_u32(8U, n);
  if (is_valid_m == 0xFFFFFFFFU)
  {
    exp_consttime(nBits, n, a, bBits, b, res);
  }
  else
  {
    memset(res, 0U, 8U * sizeof (uint32_t));
  }
  return is_valid_m == 0xFFFFFFFFU;
}